

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_extract.cpp
# Opt level: O2

ScalarFunction * duckdb::GetKeyExtractFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling null_handling;
  bind_lambda_function_t in_stack_ffffffffffffff28;
  allocator_type local_ca;
  allocator local_c9;
  code *local_c8 [2];
  code *local_b8;
  code *local_b0;
  LogicalType local_a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_90;
  LogicalType local_78;
  LogicalType local_60 [2];
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"struct_extract",&local_c9);
  LogicalType::LogicalType(local_60,STRUCT);
  LogicalType::LogicalType(local_60 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_90,__l,&local_ca);
  LogicalType::LogicalType(&local_a8,ANY);
  local_c8[1] = (code *)0x0;
  local_c8[0] = StructExtractFunction;
  local_b0 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_b8 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  null_handling = 0xdd;
  LogicalType::LogicalType(&local_78,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_90,&local_a8,
             (scalar_function_t *)local_c8,StructExtractBind,(bind_scalar_function_extended_t)0x0,
             PropagateStructExtractStats,(init_local_state_t)0x0,(LogicalType)ZEXT824(&local_78),
             CONSISTENT,null_handling,in_stack_ffffffffffffff28);
  LogicalType::~LogicalType(&local_78);
  ::std::_Function_base::~_Function_base((_Function_base *)local_c8);
  LogicalType::~LogicalType(&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_90);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_60[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

ScalarFunction GetKeyExtractFunction() {
	return ScalarFunction("struct_extract", {LogicalTypeId::STRUCT, LogicalType::VARCHAR}, LogicalType::ANY,
	                      StructExtractFunction, StructExtractBind, nullptr, PropagateStructExtractStats);
}